

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::iterate(InterCallTestCase *this)

{
  pointer *ppiVar1;
  code *pcVar2;
  TestContext *this_00;
  char cVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  long lVar8;
  undefined4 extraout_var_00;
  mapped_type *pmVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  void *__src;
  long *plVar10;
  TestError *this_01;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *pmVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong uVar13;
  pointer pCVar14;
  key_type_conflict *__k;
  char *pcVar15;
  undefined8 uVar16;
  int iVar17;
  long lVar18;
  key_type_conflict *pkVar19;
  long lVar20;
  bool bVar21;
  int programFriendlyName;
  int resultStorageFriendlyName;
  vector<int,_std::allocator<int>_> results;
  int local_1e8;
  int local_1e4;
  map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
  *local_1e0;
  code *local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  undefined4 extraout_var;
  
  local_1e8 = 0;
  local_1e4 = 0;
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Running operations:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pCVar14 = (this->m_cmds).
            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_cmds).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar14) >> 2) *
          -0x33333333) {
    local_1e0 = &this->m_storageIDs;
    lVar20 = 0xc;
    lVar18 = 0;
    do {
      switch(*(undefined4 *)((long)pCVar14 + lVar20 + -0xc)) {
      case 0:
        iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        lVar8 = CONCAT44(extraout_var_01,iVar5);
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Running program #",0x11);
        local_1e8 = local_1e8 + 1;
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," to write ",10);
        bVar21 = this->m_storage == STORAGE_BUFFER;
        pcVar15 = "image";
        if (bVar21) {
          pcVar15 = "buffer";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,pcVar15,(ulong)bVar21 + 5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," #",2);
        pkVar19 = (key_type_conflict *)((long)pCVar14 + lVar20 + -8);
        std::ostream::operator<<((ostringstream *)&local_1a8,*pkVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"\tDispatch size: ",0x10);
        std::ostream::operator<<((ostringstream *)&local_1a8,this->m_invocationGridSize);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
        std::ostream::operator<<((ostringstream *)&local_1a8,this->m_invocationGridSize);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        (**(code **)(lVar8 + 0x1680))
                  (((this->m_operationPrograms).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar18]->m_program).m_program);
        if (this->m_storage == STORAGE_IMAGE) {
          pcVar2 = *(code **)(lVar8 + 0x80);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,pkVar19);
          uVar4 = 0x822e;
          if (this->m_formatInteger != false) {
            uVar4 = 0x8235;
          }
          (*pcVar2)(0,*pmVar9,0,0,0,this->m_useAtomic + 0x88b9,uVar4);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          pcVar15 = "bind destination image";
          iVar5 = 0x5c2;
LAB_014fbbd6:
          glu::checkError(dVar7,pcVar15,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                          ,iVar5);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          local_1d8 = *(code **)(lVar8 + 0x48);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,pkVar19);
          (*local_1d8)(0x90d2,0,*pmVar9);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          pcVar15 = "bind destination buffer";
          iVar5 = 0x5bb;
          goto LAB_014fbbd6;
        }
        (**(code **)(lVar8 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        pcVar15 = "dispatch write";
        iVar5 = 0x5c9;
        goto LAB_014fbddf;
      case 1:
      case 5:
      case 6:
        runSingleRead(this,*(int *)((long)pCVar14 + lVar20 + -8),(int)lVar18,&local_1e8,&local_1e4);
        break;
      case 2:
        iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        if (this->m_storage == STORAGE_IMAGE) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,
                     "Memory Barrier\n\tbits = GL_SHADER_IMAGE_ACCESS_BARRIER_BIT",0x39);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar16 = 0x20;
        }
        else {
          if (this->m_storage != STORAGE_BUFFER) break;
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Memory Barrier\n\tbits = GL_SHADER_STORAGE_BARRIER_BIT",
                     0x34);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
          uVar16 = 0x2000;
        }
        (**(code **)(CONCAT44(extraout_var_02,iVar5) + 0xdb8))(uVar16);
        break;
      case 3:
        iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        lVar8 = CONCAT44(extraout_var,iVar5);
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Running program #",0x11);
        local_1e8 = local_1e8 + 1;
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," to verify ",0xb);
        bVar21 = this->m_storage == STORAGE_BUFFER;
        pcVar15 = "images";
        if (bVar21) {
          pcVar15 = "buffers";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,pcVar15,(ulong)bVar21 | 6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," #",2);
        pkVar19 = (key_type_conflict *)((long)pCVar14 + lVar20 + -8);
        std::ostream::operator<<((ostringstream *)&local_1a8,*pkVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," and #",6);
        std::ostream::operator<<
                  ((ostringstream *)&local_1a8,*(int *)((long)&pCVar14->type + lVar20));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"\tWriting results to result storage #",0x24);
        local_1e4 = local_1e4 + 1;
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"\tDispatch size: ",0x10);
        std::ostream::operator<<((ostringstream *)&local_1a8,this->m_invocationGridSize);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
        std::ostream::operator<<((ostringstream *)&local_1a8,this->m_invocationGridSize);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        __k = (key_type_conflict *)((long)&pCVar14->type + lVar20);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        (**(code **)(lVar8 + 0x1680))
                  (((this->m_operationPrograms).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar18]->m_program).m_program);
        pmVar11 = local_1e0;
        if (this->m_storage == STORAGE_IMAGE) {
          local_1d8 = *(code **)(lVar8 + 0x80);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,pkVar19);
          uVar4 = 0x822e;
          if (this->m_formatInteger != false) {
            uVar4 = 0x8235;
          }
          (*local_1d8)(1,*pmVar9,0,0,0,(uint)this->m_useAtomic * 2 | 35000,uVar4);
          pcVar2 = *(code **)(lVar8 + 0x80);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](pmVar11,__k);
          uVar4 = 0x822e;
          if (this->m_formatInteger != false) {
            uVar4 = 0x8235;
          }
          (*pcVar2)(2,*pmVar9,0,0,0,(uint)this->m_useAtomic * 2 | 35000,uVar4);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          pcVar15 = "bind source images";
          iVar5 = 0x603;
LAB_014fbcd7:
          glu::checkError(dVar7,pcVar15,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                          ,iVar5);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          local_1d8 = *(code **)(lVar8 + 0x48);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,pkVar19);
          (*local_1d8)(0x90d2,1,*pmVar9);
          pcVar2 = *(code **)(lVar8 + 0x48);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,__k);
          (*pcVar2)(0x90d2,2,*pmVar9);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          pcVar15 = "bind source buffers";
          iVar5 = 0x5fa;
          goto LAB_014fbcd7;
        }
        (**(code **)(lVar8 + 0x48))
                  (0x90d2,0,(this->m_operationResultStorages).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar18]);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar7,"bind result buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                        ,0x60b);
        (**(code **)(lVar8 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        pcVar15 = "dispatch read multi";
        iVar5 = 0x60f;
        goto LAB_014fbddf;
      case 4:
        iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        lVar8 = CONCAT44(extraout_var_00,iVar5);
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Running program #",0x11);
        local_1e8 = local_1e8 + 1;
        std::ostream::operator<<((ostringstream *)&local_1a8,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," to write ",10);
        bVar21 = this->m_storage == STORAGE_BUFFER;
        pcVar15 = "image";
        if (bVar21) {
          pcVar15 = "buffer";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,pcVar15,(ulong)bVar21 + 5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," #",2);
        pkVar19 = (key_type_conflict *)((long)pCVar14 + lVar20 + -8);
        std::ostream::operator<<((ostringstream *)&local_1a8,*pkVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"\tWriting to every ",0x12);
        uVar13 = (ulong)*(byte *)((long)&pCVar14->type + lVar20);
        pcVar15 = "odd";
        if (uVar13 != 0) {
          pcVar15 = "even";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar15,uVar13 + 3)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
        bVar21 = this->m_storage == STORAGE_BUFFER;
        pcVar15 = "column";
        if (bVar21) {
          pcVar15 = "element";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,pcVar15,(ulong)bVar21 | 6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"\tDispatch size: ",0x10);
        std::ostream::operator<<((ostringstream *)&local_1a8,this->m_invocationGridSize / 2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"x",1);
        std::ostream::operator<<((ostringstream *)&local_1a8,this->m_invocationGridSize);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        (**(code **)(lVar8 + 0x1680))
                  (((this->m_operationPrograms).
                    super__Vector_base<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar18]->m_program).m_program);
        if (this->m_storage == STORAGE_IMAGE) {
          pcVar2 = *(code **)(lVar8 + 0x80);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,pkVar19);
          uVar4 = 0x822e;
          if (this->m_formatInteger != false) {
            uVar4 = 0x8235;
          }
          (*pcVar2)(0,*pmVar9,0,0,0,this->m_useAtomic + 0x88b9,uVar4);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          pcVar15 = "bind destination image";
          iVar5 = 0x62c;
LAB_014fbdac:
          glu::checkError(dVar7,pcVar15,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                          ,iVar5);
        }
        else if (this->m_storage == STORAGE_BUFFER) {
          pcVar2 = *(code **)(lVar8 + 0x48);
          pmVar9 = std::
                   map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                   ::operator[](local_1e0,pkVar19);
          (*pcVar2)(0x90d2,0,*pmVar9);
          dVar7 = (**(code **)(lVar8 + 0x800))();
          pcVar15 = "bind destination buffer";
          iVar5 = 0x625;
          goto LAB_014fbdac;
        }
        (**(code **)(lVar8 + 0x528))(this->m_invocationGridSize / 2,this->m_invocationGridSize,1);
        dVar7 = (**(code **)(lVar8 + 0x800))();
        pcVar15 = "dispatch write";
        iVar5 = 0x633;
LAB_014fbddf:
        glu::checkError(dVar7,pcVar15,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                        ,iVar5);
      }
      lVar18 = lVar18 + 1;
      pCVar14 = (this->m_cmds).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x14;
    } while (lVar18 < (int)((ulong)((long)(this->m_cmds).
                                          super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar14
                                   ) >> 2) * -0x33333333);
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Reading verifier program results",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar5 = (int)((ulong)((long)(this->m_cmds).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_cmds).
                             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
  if (0 < iVar5) {
    pmVar11 = (map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
               *)0x0;
    local_1d8 = (code *)CONCAT44(local_1d8._4_4_,(int)CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),1));
    iVar5 = 0;
    do {
      if ((this->m_operationResultStorages).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)pmVar11] != 0) {
        local_1e0 = pmVar11;
        iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        lVar18 = CONCAT44(extraout_var_03,iVar6);
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_1d0,(long)(this->m_invocationGridSize * this->m_invocationGridSize),
                   (allocator_type *)local_1b0);
        (**(code **)(lVar18 + 0x40))
                  (0x90d2,(this->m_operationResultStorages).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)local_1e0]);
        __src = (void *)(**(code **)(lVar18 + 0xd00))
                                  (0x90d2,0,(long)(this->m_invocationGridSize *
                                                  this->m_invocationGridSize) << 2,1);
        dVar7 = (**(code **)(lVar18 + 0x800))();
        glu::checkError(dVar7,"map buffer",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                        ,0x57e);
        memcpy(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,__src,
               (long)(this->m_invocationGridSize * this->m_invocationGridSize) << 2);
        cVar3 = (**(code **)(lVar18 + 0x1670))(0x90d2);
        if (cVar3 != '\x01') {
          this_01 = (TestError *)__cxa_allocate_exception(0x38);
          local_1b0 = (undefined1  [8])local_1a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"memory map store corrupted","");
          tcu::TestError::TestError(this_01,(string *)local_1b0);
          __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        iVar17 = 0;
        iVar6 = iVar17;
        if (0 < (int)((ulong)((long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2)) {
          lVar18 = 0;
          iVar6 = 0;
          do {
            if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18] != 1) {
              if (iVar17 == 0) {
                local_1b0 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"Result storage #",0x10);
                iVar5 = iVar5 + 1;
                std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8," failed, got unexpected values.\n",0x20);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              if (4 < iVar17) {
                local_1b0 = (undefined1  [8])
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,"\t-- too many errors, skipping verification --\n",
                           0x2e);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
                goto LAB_014fc1e6;
              }
              local_1b0 = (undefined1  [8])
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"\tError at index ",0x10);
              std::ostream::operator<<((ostringstream *)&local_1a8,(int)lVar18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,": expected 1, got ",0x12);
              std::ostream::operator<<
                        ((ostringstream *)&local_1a8,
                         local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar18]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".\n",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              iVar17 = iVar17 + 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              iVar6 = 1;
            }
            lVar18 = lVar18 + 1;
          } while (lVar18 < (int)((ulong)((long)local_1d0.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_1d0.
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start) >> 2));
        }
        if (iVar6 == 0) {
          local_1b0 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Result storage #",0x10);
          iVar5 = iVar5 + 1;
          std::ostream::operator<<((ostringstream *)&local_1a8,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ok.",4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::ios_base::~ios_base(local_138);
        }
        else {
LAB_014fc1e6:
          local_1d8 = (code *)((ulong)local_1d8 & 0xffffffff00000000);
        }
        pmVar11 = local_1e0;
        if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          pmVar11 = local_1e0;
        }
      }
      pmVar11 = (map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
                 *)&(pmVar11->_M_t)._M_impl.field_0x1;
    } while ((long)pmVar11 <
             (long)((int)((ulong)((long)(this->m_cmds).
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->m_cmds).
                                       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::InterCallOperations::Command>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                   -0x33333333));
    if (((ulong)local_1d8 & 1) == 0) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      bVar21 = this->m_storage == STORAGE_BUFFER;
      pcVar15 = "image";
      if (bVar21) {
        pcVar15 = "buffer";
      }
      ppiVar1 = &local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppiVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,pcVar15,pcVar15 + (ulong)bVar21 + 5);
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_1d0);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar12) {
        local_1a0[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_1a0[0]._8_8_ = plVar10[3];
        local_1b0 = (undefined1  [8])local_1a0;
      }
      else {
        local_1a0[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_1b0 = (undefined1  [8])*plVar10;
      }
      local_1a8 = (_func_int **)plVar10[1];
      *plVar10 = (long)paVar12;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,(char *)local_1b0);
      if (local_1b0 != (undefined1  [8])local_1a0) {
        operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
      }
      if ((pointer *)
          local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == ppiVar1) {
        return STOP;
      }
      operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 1);
      return STOP;
    }
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

InterCallTestCase::IterateResult InterCallTestCase::iterate (void)
{
	int programFriendlyName			= 0;
	int resultStorageFriendlyName	= 0;

	m_testCtx.getLog() << tcu::TestLog::Message << "Running operations:" << tcu::TestLog::EndMessage;

	// run steps

	for (int step = 0; step < (int)m_cmds.size(); ++step)
	{
		switch (m_cmds[step].type)
		{
			case InterCallOperations::Command::TYPE_WRITE:				runCommand(m_cmds[step].u_cmd.write,			step,	programFriendlyName);								break;
			case InterCallOperations::Command::TYPE_READ:				runCommand(m_cmds[step].u_cmd.read,				step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_BARRIER:			runCommand(m_cmds[step].u_cmd.barrier);																		break;
			case InterCallOperations::Command::TYPE_READ_MULTIPLE:		runCommand(m_cmds[step].u_cmd.readMulti,		step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_WRITE_INTERLEAVE:	runCommand(m_cmds[step].u_cmd.writeInterleave,	step,	programFriendlyName);								break;
			case InterCallOperations::Command::TYPE_READ_INTERLEAVE:	runCommand(m_cmds[step].u_cmd.readInterleave,	step,	programFriendlyName, resultStorageFriendlyName);	break;
			case InterCallOperations::Command::TYPE_READ_ZERO:			runCommand(m_cmds[step].u_cmd.readZero,			step,	programFriendlyName, resultStorageFriendlyName);	break;
			default:
				DE_ASSERT(DE_FALSE);
		}
	}

	// read results from result buffers
	if (verifyResults())
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, (std::string((m_storage == STORAGE_BUFFER) ? ("buffer") : ("image")) + " content verification failed").c_str());

	return STOP;
}